

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  bool bVar1;
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  AssertionResult *assertion_result;
  key_type this_01;
  char *expression_text;
  key_type expected_predicate_value;
  long in_RDI;
  AssertionResult gtest_ar__23;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar__22;
  AssertionResult gtest_ar__21;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar__20;
  AssertionResult gtest_ar__19;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar__18;
  AssertionResult gtest_ar__17;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar__16;
  AssertionResult gtest_ar__15;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar__14;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar__13;
  AssertionResult gtest_ar__12;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__4;
  TypeParam ht;
  AssertionResult gtest_ar_2;
  const_iterator it;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  const_eq_pair;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  eq_pair;
  HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb08;
  const_iterator *this_02;
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb10;
  int index;
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_03;
  HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb18;
  HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_04;
  char *in_stack_ffffffffffffeb20;
  char *message;
  undefined4 in_stack_ffffffffffffeb28;
  int in_stack_ffffffffffffeb2c;
  char *in_stack_ffffffffffffeb30;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  *this_05;
  undefined4 in_stack_ffffffffffffeb38;
  Type in_stack_ffffffffffffeb3c;
  Type type;
  AssertHelper *in_stack_ffffffffffffeb40;
  key_type *in_stack_ffffffffffffeb48;
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb50;
  char *in_stack_ffffffffffffeb70;
  char *in_stack_ffffffffffffeb78;
  char *in_stack_ffffffffffffeb80;
  AssertionResult *in_stack_ffffffffffffeb88;
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb90;
  key_type *in_stack_ffffffffffffebd8;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  *this_06;
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffebe0;
  string local_1208 [55];
  undefined1 local_11d1;
  AssertionResult local_11d0;
  key_type local_11c0;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_11b8;
  key_type local_1168;
  size_type local_1160;
  undefined4 local_1154;
  AssertionResult local_1150;
  string local_1140 [48];
  const_iterator local_1110;
  key_type local_10f0;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_10e8;
  undefined1 local_10c1;
  AssertionResult local_10c0;
  string local_10b0 [55];
  undefined1 local_1079;
  AssertionResult local_1078;
  key_type local_1068;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_1060;
  key_type local_1010;
  char *local_1008;
  undefined4 local_ffc;
  AssertionResult local_ff8;
  string local_fe8 [48];
  iterator local_fb8;
  key_type local_f98;
  dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_f90;
  undefined1 local_f69;
  AssertionResult local_f68;
  string local_f58 [55];
  undefined1 local_f21;
  AssertionResult local_f20;
  key_type local_f10;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_f08;
  key_type local_eb8;
  size_type local_eb0;
  undefined4 local_ea4;
  AssertionResult local_ea0;
  string local_e90 [48];
  const_iterator local_e60;
  key_type local_e40;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_e38;
  undefined1 local_e11;
  AssertionResult local_e10;
  string local_e00 [55];
  undefined1 local_dc9;
  AssertionResult local_dc8;
  key_type local_db8;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_db0;
  key_type local_d60;
  size_type local_d58;
  undefined4 local_d4c;
  AssertionResult local_d48;
  string local_d38 [48];
  iterator local_d08;
  key_type local_ce8;
  dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_ce0;
  undefined1 local_cb9;
  AssertionResult local_cb8;
  string local_ca8 [55];
  undefined1 local_c71;
  AssertionResult local_c70 [2];
  key_type local_c50;
  key_type local_c48;
  AssertionResult local_c40;
  string local_c30 [55];
  undefined1 local_bf9;
  AssertionResult local_bf8;
  key_type local_be8;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_be0;
  key_type local_b90;
  size_type local_b88;
  undefined4 local_b7c;
  AssertionResult local_b78;
  string local_b68 [48];
  const_iterator local_b38;
  key_type local_b18;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_b10;
  undefined1 local_ae9;
  AssertionResult local_ae8;
  string local_ad8 [55];
  undefined1 local_aa1;
  AssertionResult local_aa0 [2];
  key_type local_a80;
  key_type local_a78;
  AssertionResult local_a70;
  string local_a60 [55];
  undefined1 local_a29;
  AssertionResult local_a28;
  key_type local_a18;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_a10;
  key_type local_9c0;
  size_type local_9b8;
  undefined4 local_9ac;
  AssertionResult local_9a8;
  string local_998 [48];
  iterator local_968;
  key_type local_948;
  dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_940;
  undefined1 local_919;
  AssertionResult local_918;
  string local_908 [55];
  undefined1 local_8d1;
  AssertionResult local_8d0 [2];
  key_type local_8b0;
  key_type local_8a8;
  AssertionResult local_8a0;
  string local_890 [55];
  undefined1 local_859;
  AssertionResult local_858;
  key_type local_848;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_840;
  key_type local_7f0;
  size_type local_7e8;
  undefined4 local_7dc;
  AssertionResult local_7d8;
  string local_7c8 [48];
  const_iterator local_798;
  key_type local_778;
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_770;
  undefined1 local_749;
  AssertionResult local_748;
  string local_738 [55];
  undefined1 local_701;
  AssertionResult local_700 [2];
  key_type local_6e0;
  key_type local_6d8;
  AssertionResult local_6d0;
  string local_6c0 [55];
  undefined1 local_689;
  AssertionResult local_688;
  key_type local_678;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_670;
  key_type local_620;
  size_type local_618;
  undefined4 local_60c;
  AssertionResult local_608;
  string local_5f8 [48];
  iterator local_5c8;
  key_type local_5a8;
  dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_5a0;
  undefined1 local_579;
  AssertionResult local_578 [11];
  key_type local_4c8;
  key_type local_4c0;
  AssertionResult local_4b8;
  key_type local_4a8;
  const_iterator *local_4a0;
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_498;
  HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *local_490;
  char *local_488;
  size_type local_450;
  undefined4 local_444;
  AssertionResult local_440 [3];
  value_type local_408;
  value_type local_3d8;
  value_type local_3a8;
  value_type local_378;
  value_type local_348;
  value_type local_318;
  value_type local_2e8;
  value_type local_2b8;
  string local_2b0 [55];
  byte local_279;
  AssertionResult local_278 [3];
  value_type local_240;
  string local_238 [55];
  undefined1 local_201;
  AssertionResult local_200;
  key_type local_1f0;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_1e8;
  key_type local_198;
  size_type local_190;
  undefined4 local_184;
  AssertionResult local_180;
  string local_170 [48];
  iterator local_140;
  key_type local_120;
  dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_118;
  undefined1 local_f1;
  AssertionResult local_f0;
  string local_e0 [71];
  undefined1 local_99;
  AssertionResult local_98;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_88;
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_48;
  
  std::
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_true>
            ((pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)in_stack_ffffffffffffeb10);
  std::
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_true>
            ((pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
              *)in_stack_ffffffffffffeb10);
  local_99 = google::
             BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xda255a);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb10,(bool *)in_stack_ffffffffffffeb08,
             (type *)0xda257c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb10);
    std::__cxx11::string::~string(local_e0);
    testing::Message::~Message((Message *)0xda263d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda26d4);
  local_120 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeb18,(int)((ulong)in_stack_ffffffffffffeb10 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb50);
  local_f1 = google::
             dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::operator==(&local_118,&local_140);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb10,(bool *)in_stack_ffffffffffffeb08,
             (type *)0xda276a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb10);
    std::__cxx11::string::~string(local_170);
    testing::Message::~Message((Message *)0xda283d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda28d4);
  local_184 = 0;
  local_198 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeb18,(int)((ulong)in_stack_ffffffffffffeb10 >> 0x20))
  ;
  local_190 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(in_stack_ffffffffffffeb10,(key_type *)in_stack_ffffffffffffeb08);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             in_stack_ffffffffffffeb20,(uint *)in_stack_ffffffffffffeb18,
             (unsigned_long *)in_stack_ffffffffffffeb10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::AssertionResult::failure_message((AssertionResult *)0xda2996);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb10);
    testing::Message::~Message((Message *)0xda29f9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda2a6a);
  local_1f0 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeb18,(int)((ulong)in_stack_ffffffffffffeb10 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
  std::
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_1e8);
  local_201 = google::
              dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb10,(bool *)in_stack_ffffffffffffeb08,
             (type *)0xda2b00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb10);
    std::__cxx11::string::~string(local_238);
    testing::Message::~Message((Message *)0xda2bd3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda2c6a);
  local_240 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb08,0);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb90,(value_type *)in_stack_ffffffffffffeb88);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xda2cc1);
  local_279 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb10,(bool *)in_stack_ffffffffffffeb08,
             (type *)0xda2ce5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_278);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb10);
    std::__cxx11::string::~string(local_2b0);
    testing::Message::~Message((Message *)0xda2db8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda2e4f);
  local_2b8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb08,0);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb90,(value_type *)in_stack_ffffffffffffeb88);
  local_2e8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb08,0);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb90,(value_type *)in_stack_ffffffffffffeb88);
  local_318 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb08,0);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb90,(value_type *)in_stack_ffffffffffffeb88);
  local_348 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb08,0);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb90,(value_type *)in_stack_ffffffffffffeb88);
  local_378 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb08,0);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb90,(value_type *)in_stack_ffffffffffffeb88);
  local_3a8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb08,0);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb90,(value_type *)in_stack_ffffffffffffeb88);
  local_3d8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb08,0);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb90,(value_type *)in_stack_ffffffffffffeb88);
  local_408 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb08,0);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeb90,(value_type *)in_stack_ffffffffffffeb88);
  local_444 = 9;
  local_450 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xda309b);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             in_stack_ffffffffffffeb20,(uint *)in_stack_ffffffffffffeb18,
             (unsigned_long *)in_stack_ffffffffffffeb10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_440);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::AssertionResult::failure_message((AssertionResult *)0xda3114);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb10);
    testing::Message::~Message((Message *)0xda3177);
  }
  index = (int)((ulong)in_stack_ffffffffffffeb10 >> 0x20);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda31e8);
  local_4a8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeb18,index);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
  it_00.super_iterator.pos._0_4_ = in_stack_ffffffffffffeb28;
  it_00.super_iterator.ht =
       (dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_488;
  it_00.super_iterator.pos._4_4_ = in_stack_ffffffffffffeb2c;
  it_00.super_iterator.end = (pointer)in_stack_ffffffffffffeb30;
  it_00.parent_._0_4_ = in_stack_ffffffffffffeb38;
  it_00.parent_._4_4_ = in_stack_ffffffffffffeb3c;
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator((const_iterator *)local_498,it_00);
  local_4c0 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key(local_4a0);
  local_4c8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(local_490,(int)((ulong)local_498 >> 0x20));
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),local_488,
             (pair<int,_int> *)local_490,(pair<int,_int> *)local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4b8);
  this_02 = local_4a0;
  this_03 = local_498;
  this_04 = local_490;
  message = local_488;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::AssertionResult::failure_message((AssertionResult *)0xda3305);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,local_488);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_498);
    testing::Message::~Message((Message *)0xda3368);
    this_02 = local_4a0;
    this_03 = local_498;
    this_04 = local_490;
    message = local_488;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda33d9);
  google::
  HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)this_03,
             (HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)this_02);
  local_5a8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb50);
  local_579 = google::
              dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_5a0,&local_5c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda3495);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_578);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_5f8);
    testing::Message::~Message((Message *)0xda3583);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda361a);
  local_60c = 1;
  local_620 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  local_618 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_03,(key_type *)this_02);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),message,
             (uint *)this_04,(unsigned_long *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_608);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::AssertionResult::failure_message((AssertionResult *)0xda3702);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0xda3765);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda37d6);
  local_678 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
  std::
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_670);
  local_689 = google::
              dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda3882);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_688);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_6c0);
    testing::Message::~Message((Message *)0xda3957);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda39ee);
  local_6d8 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::iterator::key((iterator *)this_02);
  local_6e0 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),message,
             (pair<int,_int> *)this_04,(pair<int,_int> *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::AssertionResult::failure_message((AssertionResult *)0xda3ab4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0xda3b17);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda3b85);
  google::
  dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_03);
  local_701 = google::
              dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda3bc9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_700);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_738);
    testing::Message::~Message((Message *)0xda3c9e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda3d35);
  local_778 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb50);
  local_749 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_770,&local_798);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda3dcc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_748);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_7c8);
    testing::Message::~Message((Message *)0xda3ea1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda3f38);
  local_7dc = 1;
  local_7f0 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  local_7e8 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_03,(key_type *)this_02);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),message,
             (uint *)this_04,(unsigned_long *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::AssertionResult::failure_message((AssertionResult *)0xda4011);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0xda4074);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda40e5);
  local_848 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
  std::
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_840);
  local_859 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda4182);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_858);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_890);
    testing::Message::~Message((Message *)0xda4257);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda42ee);
  local_8a8 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key(this_02);
  local_8b0 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),message,
             (pair<int,_int> *)this_04,(pair<int,_int> *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::AssertionResult::failure_message((AssertionResult *)0xda43b4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0xda4417);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda4485);
  google::
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_03);
  local_8d1 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda44c9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_908);
    testing::Message::~Message((Message *)0xda459e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda4635);
  local_948 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb50);
  local_919 = google::
              dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_940,&local_968);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda46df);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_918);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_998);
    testing::Message::~Message((Message *)0xda47b4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda484b);
  local_9ac = 1;
  local_9c0 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  local_9b8 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_03,(key_type *)this_02);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),message,
             (uint *)this_04,(unsigned_long *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::AssertionResult::failure_message((AssertionResult *)0xda4933);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0xda4996);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda4a07);
  local_a18 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
  std::
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_a10);
  local_a29 = google::
              dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda4ab3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_a60);
    testing::Message::~Message((Message *)0xda4b88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda4c1f);
  local_a78 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::iterator::key((iterator *)this_02);
  local_a80 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),message,
             (pair<int,_int> *)this_04,(pair<int,_int> *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::AssertionResult::failure_message((AssertionResult *)0xda4ce5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0xda4d48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda4db6);
  google::
  dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_03);
  local_aa1 = google::
              dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda4dfa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_aa0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_ad8);
    testing::Message::~Message((Message *)0xda4ecf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda4f66);
  local_b18 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb50);
  local_ae9 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_b10,&local_b38);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda4ffd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ae8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_b68);
    testing::Message::~Message((Message *)0xda50d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda5169);
  local_b7c = 1;
  local_b90 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  local_b88 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_03,(key_type *)this_02);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),message,
             (uint *)this_04,(unsigned_long *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::AssertionResult::failure_message((AssertionResult *)0xda5242);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0xda52a5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda5316);
  local_be8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
  std::
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_be0);
  local_bf9 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda53b3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_bf8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_c30);
    testing::Message::~Message((Message *)0xda5488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda551f);
  local_c48 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key(this_02);
  local_c50 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  testing::internal::EqHelper::Compare<std::pair<int,_int>,_std::pair<int,_int>,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),message,
             (pair<int,_int> *)this_04,(pair<int,_int> *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c40);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::AssertionResult::failure_message((AssertionResult *)0xda55e5);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0xda5648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda56b6);
  google::
  dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)this_03);
  local_c71 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda56fa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_ca8);
    testing::Message::~Message((Message *)0xda57cf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda5866);
  local_ce8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb50);
  local_cb9 = google::
              dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_ce0,&local_d08);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda5910);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_cb8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_d38);
    testing::Message::~Message((Message *)0xda59e5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda5a7c);
  local_d4c = 0;
  local_d60 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  local_d58 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_03,(key_type *)this_02);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),message,
             (uint *)this_04,(unsigned_long *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::AssertionResult::failure_message((AssertionResult *)0xda5b64);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0xda5bc7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda5c38);
  this_00 = (BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  local_db8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,in_stack_ffffffffffffebd8);
  this_06 = &local_48;
  std::
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(this_06,&local_db0);
  local_dc9 = google::
              dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)this_06,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda5ce4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_dc8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_e00);
    testing::Message::~Message((Message *)0xda5db9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda5e50);
  local_e40 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb50);
  local_e11 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_e38,&local_e60);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda5ee7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e10);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_e90);
    testing::Message::~Message((Message *)0xda5fbc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda6053);
  local_ea4 = 0;
  local_eb8 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  local_eb0 = google::
              BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_03,(key_type *)this_02);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),message,
             (uint *)this_04,(unsigned_long *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ea0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::AssertionResult::failure_message((AssertionResult *)0xda612c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0xda618f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda6200);
  local_f10 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,(key_type *)this_06);
  std::
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_f08);
  local_f21 = google::
              dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda629d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_f58);
    testing::Message::~Message((Message *)0xda6372);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda6409);
  local_f98 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb50);
  local_f69 = google::
              dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_f90,&local_fb8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda64b3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78,
               in_stack_ffffffffffffeb70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeb90,(Message *)in_stack_ffffffffffffeb88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_fe8);
    testing::Message::~Message((Message *)0xda6588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda661f);
  local_ffc = 0;
  assertion_result = (AssertionResult *)(in_RDI + 0x10);
  this_01 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  local_1010 = this_01;
  expression_text =
       (char *)google::
               BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_03,(key_type *)this_02);
  local_1008 = expression_text;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),message,
             (uint *)this_04,(unsigned_long *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ff8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    in_stack_ffffffffffffeb78 =
         testing::AssertionResult::failure_message((AssertionResult *)0xda6701);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0xda675e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda67cf);
  expected_predicate_value =
       HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  local_1068 = expected_predicate_value;
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,(key_type *)this_06);
  std::
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_1060);
  local_1079 = google::
               dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda6869);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1078);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,in_stack_ffffffffffffeb78,
               (char *)expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_10b0);
    testing::Message::~Message((Message *)0xda693e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda69d5);
  local_10f0 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48);
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb50);
  local_10c1 = google::
               dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==(&local_10e8,&local_1110);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda6a66);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_10c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,in_stack_ffffffffffffeb78,
               (char *)expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_1140);
    testing::Message::~Message((Message *)0xda6b3b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda6bd2);
  local_1154 = 0;
  local_1168 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  local_1160 = google::
               BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_03,(key_type *)this_02);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),message,
             (uint *)this_04,(unsigned_long *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1150);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    in_stack_ffffffffffffeb40 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xda6c9f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,in_stack_ffffffffffffeb3c,in_stack_ffffffffffffeb30,
               in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0xda6cfc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda6d6d);
  local_11c0 = HashtableTest<google::HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_04,(int)((ulong)this_03 >> 0x20));
  type = local_11c0.second;
  google::
  BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,(key_type *)this_06);
  this_05 = &local_88;
  std::
  pair<google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(this_05,&local_11b8);
  local_11d1 = google::
               dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((dense_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                             *)this_05,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_03,(bool *)this_02,(type *)0xda6dfe);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_11d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,in_stack_ffffffffffffeb78,
               (char *)expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb40,type,(char *)this_05,in_stack_ffffffffffffeb2c,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_1208);
    testing::Message::~Message((Message *)0xda6ed3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xda6f67);
  google::
  HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashtable
            ((HashtableInterface_DenseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_kEmptyIntPair,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xda6f74);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, FindAndCountAndEqualRange) {
  pair<typename TypeParam::iterator, typename TypeParam::iterator> eq_pair;
  pair<typename TypeParam::const_iterator, typename TypeParam::const_iterator>
      const_eq_pair;

  EXPECT_TRUE(this->ht_.empty());
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  typename TypeParam::const_iterator it = this->ht_.find(this->UniqueKey(1));
  EXPECT_EQ(it.key(), this->UniqueKey(1));

  // Allow testing the const version of the methods as well.
  const TypeParam ht = this->ht_;

  // Some successful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(1));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(1)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(1)));
  const_eq_pair = ht.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(1));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11111)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(11111)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(11111));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11111)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(11111)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(11111));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  // Some unsuccessful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11112)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11112)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11112)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11112)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11110)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11110)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11110)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11110)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);
}